

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O1

StringTree * __thiscall
kj::StringTree::
concat<kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,StringTree *params,
          ArrayPtr<const_char> *params_1,String *params_2,ArrayPtr<const_char> *params_3,
          ArrayPtr<const_char> *params_4,ArrayPtr<const_char> *params_5,
          ArrayPtr<const_char> *params_6,ArrayPtr<const_char> *params_7,
          ArrayPtr<const_char> *params_8,String *params_9,ArrayPtr<const_char> *params_10,
          CappedArray<char,_14UL> *params_11,ArrayPtr<const_char> *params_12)

{
  ArrayDisposer *pAVar1;
  Branch *pBVar2;
  size_t result;
  size_t sVar3;
  long lVar4;
  char *pcVar5;
  size_t result_2;
  String local_d8;
  size_t local_b8;
  char *local_b0;
  size_t local_a8;
  size_t local_a0;
  size_t sStack_98;
  size_t local_90;
  size_t sStack_88;
  size_t local_80;
  size_t sStack_78;
  size_t local_70;
  size_t local_68;
  char *pcStack_60;
  undefined8 local_58;
  StringTree *local_50;
  ArrayPtr<const_char> *local_48;
  ArrayPtr<const_char> *local_40;
  ArrayPtr<const_char> *local_38;
  
  sVar3 = 0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->text).content.size_ = 0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  __return_storage_ptr__->size_ = 0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  local_b8 = this->size_;
  local_b0 = (params->text).content.ptr;
  local_a8 = params_1->size_ - 1;
  if (params_1->size_ == 0) {
    local_a8 = sVar3;
  }
  local_a0 = (params_2->content).size_;
  sStack_98 = params_3->size_;
  local_90 = params_4->size_;
  sStack_88 = params_5->size_;
  local_80 = params_6->size_;
  sStack_78 = params_7->size_;
  local_70 = params_8->size_ - 1;
  if (params_8->size_ == 0) {
    local_70 = sVar3;
  }
  local_68 = (params_9->content).size_;
  pcStack_60 = params_10->ptr;
  local_58 = *(undefined8 *)params_11->content;
  lVar4 = 0;
  do {
    sVar3 = sVar3 + *(long *)((long)&local_b8 + lVar4);
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x68);
  __return_storage_ptr__->size_ = sVar3;
  sVar3 = 0;
  local_b8 = 0;
  local_a8 = 0;
  local_70 = 0;
  lVar4 = 0;
  do {
    sVar3 = sVar3 + *(long *)((long)&local_b8 + lVar4);
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x68);
  local_50 = params;
  local_48 = params_1;
  local_40 = params_3;
  local_38 = (ArrayPtr<const_char> *)params_2;
  heapString(&local_d8,sVar3);
  pcVar5 = (__return_storage_ptr__->text).content.ptr;
  if (pcVar5 != (char *)0x0) {
    sVar3 = (__return_storage_ptr__->text).content.size_;
    (__return_storage_ptr__->text).content.ptr = (char *)0x0;
    (__return_storage_ptr__->text).content.size_ = 0;
    pAVar1 = (__return_storage_ptr__->text).content.disposer;
    (**pAVar1->_vptr_ArrayDisposer)(pAVar1,pcVar5,1,sVar3,sVar3,0);
  }
  (__return_storage_ptr__->text).content.ptr = local_d8.content.ptr;
  (__return_storage_ptr__->text).content.size_ = local_d8.content.size_;
  (__return_storage_ptr__->text).content.disposer = local_d8.content.disposer;
  local_b8 = 1;
  sVar3 = 0;
  local_b0 = (char *)0x0;
  local_a8 = 1;
  local_a0 = 0;
  sStack_98 = 0;
  local_90 = 0;
  sStack_88 = 0;
  local_80 = 0;
  sStack_78 = 0;
  local_70 = 1;
  local_68 = 0;
  pcStack_60 = (char *)0x0;
  local_58 = 0;
  lVar4 = 0;
  do {
    sVar3 = sVar3 + *(long *)((long)&local_b8 + lVar4);
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0x68);
  local_d8.content.ptr =
       (char *)_::HeapArrayDisposer::allocateImpl
                         (0x40,sVar3,sVar3,
                          _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch>::construct,
                          ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  local_d8.content.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pBVar2 = (__return_storage_ptr__->branches).ptr;
  local_d8.content.size_ = sVar3;
  if (pBVar2 != (Branch *)0x0) {
    sVar3 = (__return_storage_ptr__->branches).size_;
    (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
    (__return_storage_ptr__->branches).size_ = 0;
    pAVar1 = (__return_storage_ptr__->branches).disposer;
    (**pAVar1->_vptr_ArrayDisposer)
              (pAVar1,pBVar2,0x40,sVar3,sVar3,
               ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  }
  (__return_storage_ptr__->branches).ptr = (Branch *)local_d8.content.ptr;
  (__return_storage_ptr__->branches).size_ = local_d8.content.size_;
  (__return_storage_ptr__->branches).disposer = local_d8.content.disposer;
  pcVar5 = (char *)(__return_storage_ptr__->text).content.size_;
  if (pcVar5 != (char *)0x0) {
    pcVar5 = (__return_storage_ptr__->text).content.ptr;
  }
  fill<kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pcVar5,0,this,(ArrayPtr<const_char> *)local_50,
             (String *)local_48,local_38,local_40,params_4,params_5,params_6,params_7,
             (String *)params_8,(ArrayPtr<const_char> *)params_9,
             (CappedArray<char,_14UL> *)params_10,(ArrayPtr<const_char> *)params_11);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}